

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecPat.c
# Opt level: O2

Vec_Ptr_t * Cec_ManPatPackPatterns(Vec_Int_t *vCexStore,int nInputs,int nRegs,int nWordsInit)

{
  int iVar1;
  int iVar2;
  int iWord;
  int iVar3;
  int iVar4;
  Vec_Int_t *p;
  int *piVar5;
  Vec_Ptr_t *vInfo;
  Vec_Ptr_t *vInfo_00;
  int iVar6;
  int iVar7;
  
  if (nInputs < nRegs) {
    __assert_fail("nRegs <= nInputs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecPat.c"
                  ,0x209,"Vec_Ptr_t *Cec_ManPatPackPatterns(Vec_Int_t *, int, int, int)");
  }
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  piVar5 = (int *)malloc(400);
  p->pArray = piVar5;
  vInfo = Vec_PtrAllocSimInfo(nInputs,nWordsInit);
  iVar6 = 0;
  Vec_PtrCleanSimInfo(vInfo,0,nWordsInit);
  Gia_ManRandomInfo(vInfo,nRegs,0,nWordsInit);
  vInfo_00 = Vec_PtrAllocSimInfo(nInputs,nWordsInit);
  Vec_PtrCleanSimInfo(vInfo_00,0,nWordsInit);
  iVar2 = nWordsInit << 5;
  iWord = nWordsInit;
  do {
    do {
      do {
        if (vCexStore->nSize <= iVar6) {
          Vec_PtrFree(vInfo_00);
          free(p->pArray);
          free(p);
          return vInfo;
        }
        iVar1 = iVar6 + 2;
        iVar3 = Vec_IntEntry(vCexStore,iVar6 + 1);
        iVar6 = iVar1;
      } while (iVar3 < 1);
      p->nSize = 0;
      iVar6 = iVar3 + iVar1;
      for (iVar7 = 0; iVar3 != iVar7; iVar7 = iVar7 + 1) {
        iVar4 = Vec_IntEntry(vCexStore,iVar1 + iVar7);
        Vec_IntPush(p,iVar4);
      }
      for (iVar7 = 1; iVar7 < iVar2;
          iVar7 = iVar7 + 1 + (uint)((iVar7 + 1) % (nWordsInit << 5) == 0)) {
        iVar4 = Cec_ManPatCollectTry(vInfo,vInfo_00,iVar7,p->pArray,p->nSize);
        if (iVar4 != 0) break;
      }
    } while (iVar7 != iVar2 + -1);
    Vec_PtrReallocSimInfo(vInfo);
    iVar7 = iWord * 2;
    Vec_PtrCleanSimInfo(vInfo,iWord,iVar7);
    Gia_ManRandomInfo(vInfo,nRegs,iWord,iVar7);
    Vec_PtrReallocSimInfo(vInfo_00);
    Vec_PtrCleanSimInfo(vInfo_00,iWord,iVar7);
    iVar2 = iVar2 * 2;
    iVar6 = iVar3 + iVar1;
    iWord = iVar7;
  } while( true );
}

Assistant:

Vec_Ptr_t * Cec_ManPatPackPatterns( Vec_Int_t * vCexStore, int nInputs, int nRegs, int nWordsInit )
{
    Vec_Int_t * vPat;
    Vec_Ptr_t * vInfo, * vPres;
    int k, nSize, iStart, kMax = 0, nPatterns = 0;
    int nWords = nWordsInit;
    int nBits = 32 * nWords;
//    int RetValue;
    assert( nRegs <= nInputs );
    vPat  = Vec_IntAlloc( 100 );

    vInfo = Vec_PtrAllocSimInfo( nInputs, nWords );
    Vec_PtrCleanSimInfo( vInfo, 0, nWords );
    Gia_ManRandomInfo( vInfo, nRegs, 0, nWords );

    vPres = Vec_PtrAllocSimInfo( nInputs, nWords );
    Vec_PtrCleanSimInfo( vPres, 0, nWords );
    iStart = 0;
    while ( iStart < Vec_IntSize(vCexStore) )
    {
        nPatterns++;
        // skip the output number
        iStart++;
        // get the number of items
        nSize = Vec_IntEntry( vCexStore, iStart++ );
        if ( nSize <= 0 )
            continue;
        // extract pattern
        Vec_IntClear( vPat );
        for ( k = 0; k < nSize; k++ )
            Vec_IntPush( vPat, Vec_IntEntry( vCexStore, iStart++ ) );
        // add pattern to storage
        for ( k = 1; k < nBits; k++, k += ((k % (32 * nWordsInit)) == 0) )
            if ( Cec_ManPatCollectTry( vInfo, vPres, k, (int *)Vec_IntArray(vPat), Vec_IntSize(vPat) ) )
                break;

//        k = kMax + 1;
//        RetValue = Cec_ManPatCollectTry( vInfo, vPres, k, (int *)Vec_IntArray(vPat), Vec_IntSize(vPat) );
//        assert( RetValue == 1 );

        kMax = Abc_MaxInt( kMax, k );
        if ( k == nBits-1 )
        {
            Vec_PtrReallocSimInfo( vInfo );
            Vec_PtrCleanSimInfo( vInfo, nWords, 2*nWords );
            Gia_ManRandomInfo( vInfo, nRegs, nWords, 2*nWords );

            Vec_PtrReallocSimInfo( vPres );
            Vec_PtrCleanSimInfo( vPres, nWords, 2*nWords );
            nWords *= 2;
            nBits *= 2;
        }
    }
//    Abc_Print( 1, "packed %d patterns into %d vectors (out of %d)\n", nPatterns, kMax, nBits );
    Vec_PtrFree( vPres );
    Vec_IntFree( vPat );
    return vInfo;
}